

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::BackgroundCall(DBImpl *this)

{
  bool bVar1;
  MutexLock local_18;
  MutexLock l;
  DBImpl *this_local;
  
  l.mu_ = (Mutex *)this;
  MutexLock::MutexLock(&local_18,&this->mutex_);
  if ((this->background_compaction_scheduled_ & 1U) == 0) {
    __assert_fail("background_compaction_scheduled_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                  ,0x29e,"void leveldb::DBImpl::BackgroundCall()");
  }
  bVar1 = std::atomic<bool>::load(&this->shutting_down_,memory_order_acquire);
  if ((!bVar1) && (bVar1 = Status::ok(&this->bg_error_), bVar1)) {
    BackgroundCompaction(this);
  }
  this->background_compaction_scheduled_ = false;
  MaybeScheduleCompaction(this);
  port::CondVar::SignalAll(&this->background_work_finished_signal_);
  MutexLock::~MutexLock(&local_18);
  return;
}

Assistant:

void DBImpl::BackgroundCall() {
  MutexLock l(&mutex_);
  assert(background_compaction_scheduled_);
  if (shutting_down_.load(std::memory_order_acquire)) {
    // No more background work when shutting down.
  } else if (!bg_error_.ok()) {
    // No more background work after a background error.
  } else {
    BackgroundCompaction();
  }

  background_compaction_scheduled_ = false;

  // Previous compaction may have produced too many files in a level,
  // so reschedule another compaction if needed.
  MaybeScheduleCompaction();
  background_work_finished_signal_.SignalAll();
}